

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen.h
# Opt level: O2

Enum * __thiscall
flatbuffers::BaseBfbsGenerator::GetEnumByIndex(BaseBfbsGenerator *this,int32_t index)

{
  Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *pVVar1;
  return_type pEVar2;
  
  if (-1 < index && this->schema_ != (Schema *)0x0) {
    pVVar1 = reflection::Schema::enums(this->schema_);
    if (index < *(int *)pVVar1) {
      pVVar1 = reflection::Schema::enums(this->schema_);
      pEVar2 = Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>::Get(pVVar1,index);
      return pEVar2;
    }
  }
  return (Enum *)0x0;
}

Assistant:

const reflection::Enum *GetEnumByIndex(int32_t index) const {
    if (!schema_ || index < 0 ||
        index >= static_cast<int32_t>(schema_->enums()->size())) {
      return nullptr;
    }
    return schema_->enums()->Get(index);
  }